

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decode.c
# Opt level: O0

BrotliDecoderErrorCode
DecodeVarLenUint8(BrotliDecoderStateInternal *s,BrotliBitReader *br,uint32_t *value)

{
  BrotliRunningDecodeUint8State BVar1;
  uint uVar2;
  bool bVar3;
  uint local_17c;
  uint32_t bits;
  uint32_t *value_local;
  BrotliBitReader *br_local;
  BrotliDecoderStateInternal *s_local;
  
  BVar1 = s->substate_decode_uint8;
  if (BVar1 == BROTLI_STATE_DECODE_UINT8_NONE) {
    while (br->bit_pos_ == 0x40) {
      if (br->avail_in == 0) {
        bVar3 = false;
        goto LAB_00105221;
      }
      br->val_ = br->val_ >> 8;
      br->val_ = (ulong)*br->next_in << 0x38 | br->val_;
      br->bit_pos_ = br->bit_pos_ - 8;
      br->avail_in = br->avail_in - 1;
      br->next_in = br->next_in + 1;
    }
    local_17c = (uint)(br->val_ >> ((byte)br->bit_pos_ & 0x3f)) & 1;
    br->bit_pos_ = br->bit_pos_ + 1;
    bVar3 = true;
LAB_00105221:
    if (!bVar3) {
      return BROTLI_DECODER_NEEDS_MORE_INPUT;
    }
    if (local_17c == 0) {
      *value = 0;
      return BROTLI_DECODER_SUCCESS;
    }
  }
  else if (BVar1 != BROTLI_STATE_DECODE_UINT8_SHORT) {
    if (BVar1 != BROTLI_STATE_DECODE_UINT8_LONG) {
      return BROTLI_DECODER_ERROR_UNREACHABLE;
    }
    goto LAB_00105481;
  }
  while (0x40 - br->bit_pos_ < 3) {
    if (br->avail_in == 0) {
      bVar3 = false;
      goto LAB_00105403;
    }
    br->val_ = br->val_ >> 8;
    br->val_ = (ulong)*br->next_in << 0x38 | br->val_;
    br->bit_pos_ = br->bit_pos_ - 8;
    br->avail_in = br->avail_in - 1;
    br->next_in = br->next_in + 1;
  }
  local_17c = (uint)(br->val_ >> ((byte)br->bit_pos_ & 0x3f)) & 7;
  br->bit_pos_ = br->bit_pos_ + 3;
  bVar3 = true;
LAB_00105403:
  if (!bVar3) {
    s->substate_decode_uint8 = BROTLI_STATE_DECODE_UINT8_SHORT;
    return BROTLI_DECODER_NEEDS_MORE_INPUT;
  }
  if (local_17c == 0) {
    *value = 1;
    s->substate_decode_uint8 = BROTLI_STATE_DECODE_UINT8_NONE;
    return BROTLI_DECODER_SUCCESS;
  }
  *value = local_17c;
LAB_00105481:
  uVar2 = *value;
  do {
    if (uVar2 <= 0x40 - br->bit_pos_) {
      local_17c = (uint)(br->val_ >> ((byte)br->bit_pos_ & 0x3f)) & kBitMask[uVar2];
      br->bit_pos_ = uVar2 + br->bit_pos_;
      bVar3 = true;
LAB_0010560d:
      if (bVar3) {
        *value = (1 << ((byte)*value & 0x1f)) + local_17c;
        s->substate_decode_uint8 = BROTLI_STATE_DECODE_UINT8_NONE;
        s_local._4_4_ = BROTLI_DECODER_SUCCESS;
      }
      else {
        s->substate_decode_uint8 = BROTLI_STATE_DECODE_UINT8_LONG;
        s_local._4_4_ = BROTLI_DECODER_NEEDS_MORE_INPUT;
      }
      return s_local._4_4_;
    }
    if (br->avail_in == 0) {
      bVar3 = false;
      goto LAB_0010560d;
    }
    br->val_ = br->val_ >> 8;
    br->val_ = (ulong)*br->next_in << 0x38 | br->val_;
    br->bit_pos_ = br->bit_pos_ - 8;
    br->avail_in = br->avail_in - 1;
    br->next_in = br->next_in + 1;
  } while( true );
}

Assistant:

static BROTLI_NOINLINE BrotliDecoderErrorCode DecodeVarLenUint8(
    BrotliDecoderState* s, BrotliBitReader* br, uint32_t* value) {
  uint32_t bits;
  switch (s->substate_decode_uint8) {
    case BROTLI_STATE_DECODE_UINT8_NONE:
      if (BROTLI_PREDICT_FALSE(!BrotliSafeReadBits(br, 1, &bits))) {
        return BROTLI_DECODER_NEEDS_MORE_INPUT;
      }
      if (bits == 0) {
        *value = 0;
        return BROTLI_DECODER_SUCCESS;
      }
      /* No break, transit to the next state. */

    case BROTLI_STATE_DECODE_UINT8_SHORT:
      if (BROTLI_PREDICT_FALSE(!BrotliSafeReadBits(br, 3, &bits))) {
        s->substate_decode_uint8 = BROTLI_STATE_DECODE_UINT8_SHORT;
        return BROTLI_DECODER_NEEDS_MORE_INPUT;
      }
      if (bits == 0) {
        *value = 1;
        s->substate_decode_uint8 = BROTLI_STATE_DECODE_UINT8_NONE;
        return BROTLI_DECODER_SUCCESS;
      }
      /* Use output value as a temporary storage. It MUST be persisted. */
      *value = bits;
      /* No break, transit to the next state. */

    case BROTLI_STATE_DECODE_UINT8_LONG:
      if (BROTLI_PREDICT_FALSE(!BrotliSafeReadBits(br, *value, &bits))) {
        s->substate_decode_uint8 = BROTLI_STATE_DECODE_UINT8_LONG;
        return BROTLI_DECODER_NEEDS_MORE_INPUT;
      }
      *value = (1U << *value) + bits;
      s->substate_decode_uint8 = BROTLI_STATE_DECODE_UINT8_NONE;
      return BROTLI_DECODER_SUCCESS;

    default:
      return
          BROTLI_FAILURE(BROTLI_DECODER_ERROR_UNREACHABLE);
  }
}